

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

string * __thiscall
tinyformat::format<char[12],char_const*>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,char (*args) [12],char **args_1
          )

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostream oStack_1a8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_1a8);
  format<char[12],char_const*>(&oStack_1a8,(char *)this,(char (*) [12])fmt,(char **)args);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_1a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}